

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O3

int damroll(int num,int sides)

{
  uint32_t uVar1;
  int iVar2;
  
  iVar2 = 0;
  if (0 < num && 0 < sides) {
    iVar2 = 0;
    do {
      uVar1 = Rand_div(sides);
      iVar2 = iVar2 + uVar1 + 1;
      num = num + -1;
    } while (num != 0);
  }
  return iVar2;
}

Assistant:

int damroll(int num, int sides)
{
	int i;
	int sum = 0;

	if (sides <= 0) return 0;

	for (i = 0; i < num; i++)
		sum += randint1(sides);
	return sum;
}